

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::MultiNode<int,_QTextFrame_*>_>::freeData
          (Span<QHashPrivate::MultiNode<int,_QTextFrame_*>_> *this)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  
  if (this->entries != (Entry *)0x0) {
    lVar3 = 0;
    do {
      if (this->offsets[lVar3] != 0xff) {
        pvVar2 = *(void **)(this->entries[this->offsets[lVar3]].storage.data + 8);
        while (pvVar2 != (void *)0x0) {
          pvVar1 = *(void **)((long)pvVar2 + 8);
          operator_delete(pvVar2,0x10);
          pvVar2 = pvVar1;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }